

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O0

void __thiscall PatternGridHeader::changeEvent(PatternGridHeader *this,QEvent *evt)

{
  Type TVar1;
  QFont *pQVar2;
  QFont local_28 [8];
  QFont font_;
  QEvent *evt_local;
  PatternGridHeader *this_local;
  
  TVar1 = QEvent::type(evt);
  if ((TVar1 == FontChange) && ((this->mUpdatingFont & 1U) == 0)) {
    this->mUpdatingFont = true;
    pQVar2 = QWidget::font(&this->super_QWidget);
    QFont::QFont(local_28,pQVar2);
    QFont::setPixelSize((int)local_28);
    QWidget::setFont((QFont *)this);
    this->mUpdatingFont = false;
    QFont::~QFont(local_28);
  }
  return;
}

Assistant:

void PatternGridHeader::changeEvent(QEvent *evt) {
    if (evt->type() == QEvent::FontChange) {
        if (!mUpdatingFont) {
            mUpdatingFont = true;

            // force the set font to have a height of 12 pixels
            auto font_ = font();
            font_.setPixelSize(12);
            setFont(font_);

            mUpdatingFont = false;
        }
    }
}